

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  byte bVar1;
  FieldDescriptor *this;
  char *pcVar2;
  double dVar3;
  bool bVar4;
  int32_t iVar5;
  uint32_t uVar6;
  int iVar7;
  Descriptor *v2;
  Reflection *this_00;
  Reflection *this_01;
  LogMessageData *pLVar8;
  MessageFactory *pMVar9;
  MessageFactory *pMVar10;
  MapFieldBase *this_02;
  MapFieldBase *this_03;
  Message *pMVar11;
  uint64_t uVar12;
  EnumValueDescriptor *pEVar13;
  int64_t iVar14;
  MessageFactory *pMVar15;
  Message *pMVar16;
  Nonnull<const_char_*> pcVar17;
  SooRep *this_04;
  UnknownFieldSet *this_05;
  UnknownFieldSet *other;
  LogMessage *pLVar18;
  undefined8 extraout_RAX;
  int index;
  bool bVar19;
  float fVar20;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view v_00;
  Metadata MVar21;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  LogMessageData *local_90;
  LogMessageData *local_88;
  string local_80;
  string local_60;
  LogMessageFatal local_40;
  
  if (from == to) {
    pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                        (from,to,"&from != to");
  }
  else {
    pcVar17 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar17 != (Nonnull<const_char_*>)0x0) {
    Merge();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_a8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  MVar21 = Message::GetMetadata(from);
  v2 = MVar21.descriptor;
  MVar21 = Message::GetMetadata(to);
  if (MVar21.descriptor == v2) {
    pcVar17 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                        (MVar21.descriptor,v2,"to->GetDescriptor() == descriptor");
  }
  if (pcVar17 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x36,pcVar17);
    str._M_str = "Tried to merge messages of different types ";
    str._M_len = 0x2b;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_a8,str);
    str_00._M_str = "(merge ";
    str_00._M_len = 7;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_a8,str_00);
    pcVar2 = (v2->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    pLVar18 = absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_a8,v);
    str_01._M_str = " to ";
    str_01._M_len = 4;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar18,str_01)
    ;
    MVar21 = Message::GetMetadata(to);
    pcVar2 = ((MVar21.descriptor)->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v_00._M_str = pcVar2 + ~v_00._M_len;
    pLVar18 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar18,v_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar18,(char (*) [2])0x3ca147);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a8);
  }
  this_00 = GetReflectionOrDie(from);
  this_01 = GetReflectionOrDie(to);
  local_90 = (LogMessageData *)Reflection::GetMessageFactory(this_00);
  pLVar8 = (LogMessageData *)MessageFactory::generated_factory();
  pMVar9 = Reflection::GetMessageFactory(this_01);
  pMVar10 = MessageFactory::generated_factory();
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,from,&local_a8);
  local_88 = (LogMessageData *)
             local_a8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar19 = local_90 == pLVar8;
    pLVar8 = (LogMessageData *)
             local_a8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this = (FieldDescriptor *)(pLVar8->entry).full_filename_._M_len;
      bVar1 = this->field_0x1;
      bVar4 = (bool)((bVar1 & 0x20) >> 5);
      local_90 = pLVar8;
      if (0xbf < bVar1 == bVar4) {
        pcVar17 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar4,0xbf < bVar1,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar17 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar17);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      if ((this->field_0x1 & 0x20) == 0) {
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4)) {
        case 1:
          iVar5 = Reflection::GetInt32(this_00,from,this);
          Reflection::SetInt32(this_01,to,this,iVar5);
          break;
        case 2:
          iVar14 = Reflection::GetInt64(this_00,from,this);
          Reflection::SetInt64(this_01,to,this,iVar14);
          break;
        case 3:
          uVar6 = Reflection::GetUInt32(this_00,from,this);
          Reflection::SetUInt32(this_01,to,this,uVar6);
          break;
        case 4:
          uVar12 = Reflection::GetUInt64(this_00,from,this);
          Reflection::SetUInt64(this_01,to,this,uVar12);
          break;
        case 5:
          dVar3 = Reflection::GetDouble(this_00,from,this);
          Reflection::SetDouble(this_01,to,this,dVar3);
          break;
        case 6:
          fVar20 = Reflection::GetFloat(this_00,from,this);
          Reflection::SetFloat(this_01,to,this,fVar20);
          break;
        case 7:
          bVar4 = Reflection::GetBool(this_00,from,this);
          Reflection::SetBool(this_01,to,this,bVar4);
          break;
        case 8:
          pEVar13 = Reflection::GetEnum(this_00,from,this);
          Reflection::SetEnum(this_01,to,this,pEVar13);
          break;
        case 9:
          Reflection::GetString_abi_cxx11_(&local_80,this_00,from,this);
          Reflection::SetString(this_01,to,this,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          break;
        case 10:
          pMVar11 = Reflection::GetMessage(this_00,from,this,(MessageFactory *)0x0);
          if (this_00 == this_01) {
            MVar21 = Message::GetMetadata(pMVar11);
            pMVar15 = Reflection::GetMessageFactory(MVar21.reflection);
          }
          else {
            pMVar15 = (MessageFactory *)0x0;
          }
          pMVar16 = Reflection::MutableMessage(this_01,to,this,pMVar15);
          Message::MergeFrom(pMVar16,pMVar11);
        }
      }
      else {
        if ((((pMVar9 != pMVar10) != bVar19) && (this->type_ == '\v')) &&
           (bVar4 = FieldDescriptor::is_map_message_type(this), bVar4)) {
          this_02 = Reflection::GetMapData(this_00,from,this);
          this_03 = Reflection::MutableMapData(this_01,to,this);
          bVar4 = MapFieldBase::IsMapValid(this_03);
          if ((bVar4) && (bVar4 = MapFieldBase::IsMapValid(this_02), bVar4)) {
            MapFieldBase::MergeFrom(this_03,this_02);
            goto switchD_00300ff1_default;
          }
        }
        iVar7 = Reflection::FieldSize(this_00,from,this);
        if (0 < iVar7) {
          index = 0;
          do {
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4)) {
            case 1:
              iVar5 = Reflection::GetRepeatedInt32(this_00,from,this,index);
              Reflection::AddInt32(this_01,to,this,iVar5);
              break;
            case 2:
              iVar14 = Reflection::GetRepeatedInt64(this_00,from,this,index);
              Reflection::AddInt64(this_01,to,this,iVar14);
              break;
            case 3:
              uVar6 = Reflection::GetRepeatedUInt32(this_00,from,this,index);
              Reflection::AddUInt32(this_01,to,this,uVar6);
              break;
            case 4:
              uVar12 = Reflection::GetRepeatedUInt64(this_00,from,this,index);
              Reflection::AddUInt64(this_01,to,this,uVar12);
              break;
            case 5:
              dVar3 = Reflection::GetRepeatedDouble(this_00,from,this,index);
              Reflection::AddDouble(this_01,to,this,dVar3);
              break;
            case 6:
              fVar20 = Reflection::GetRepeatedFloat(this_00,from,this,index);
              Reflection::AddFloat(this_01,to,this,fVar20);
              break;
            case 7:
              bVar4 = Reflection::GetRepeatedBool(this_00,from,this,index);
              Reflection::AddBool(this_01,to,this,bVar4);
              break;
            case 8:
              pEVar13 = Reflection::GetRepeatedEnum(this_00,from,this,index);
              Reflection::AddEnum(this_01,to,this,pEVar13);
              break;
            case 9:
              Reflection::GetRepeatedString_abi_cxx11_(&local_60,this_00,from,this,index);
              Reflection::AddString(this_01,to,this,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              break;
            case 10:
              pMVar11 = Reflection::GetRepeatedMessage(this_00,from,this,index);
              if (this_00 == this_01) {
                MVar21 = Message::GetMetadata(pMVar11);
                pMVar15 = Reflection::GetMessageFactory(MVar21.reflection);
              }
              else {
                pMVar15 = (MessageFactory *)0x0;
              }
              pMVar16 = Reflection::AddMessage(this_01,to,this,pMVar15);
              Message::MergeFrom(pMVar16,pMVar11);
            }
            index = index + 1;
          } while (iVar7 != index);
        }
      }
switchD_00300ff1_default:
      pLVar8 = (LogMessageData *)&(local_90->entry).full_filename_._M_str;
    } while (pLVar8 != local_88);
  }
  this_04 = (SooRep *)Reflection::GetUnknownFields(this_00,from);
  iVar7 = SooRep::size(this_04,(undefined1  [16])
                               ((undefined1  [16])this_04->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
  if (iVar7 != 0) {
    this_05 = Reflection::MutableUnknownFields(this_01,to);
    other = Reflection::GetUnknownFields(this_00,from);
    UnknownFieldSet::MergeFrom(this_05,other);
  }
  if ((LogMessageData *)
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (LogMessageData *)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  ABSL_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  ABSL_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            const Message& from_child =
                from_reflection->GetRepeatedMessage(from, field, j);
            if (from_reflection == to_reflection) {
              to_reflection
                  ->AddMessage(to, field,
                               from_child.GetReflection()->GetMessageFactory())
                  ->MergeFrom(from_child);
            } else {
              to_reflection->AddMessage(to, field)->MergeFrom(from_child);
            }
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          const Message& from_child = from_reflection->GetMessage(from, field);
          if (from_reflection == to_reflection) {
            to_reflection
                ->MutableMessage(
                    to, field, from_child.GetReflection()->GetMessageFactory())
                ->MergeFrom(from_child);
          } else {
            to_reflection->MutableMessage(to, field)->MergeFrom(from_child);
          }
          break;
      }
    }
  }

  if (!from_reflection->GetUnknownFields(from).empty()) {
    to_reflection->MutableUnknownFields(to)->MergeFrom(
        from_reflection->GetUnknownFields(from));
  }
}